

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS ref_shard_extract_tri(REF_GRID ref_grid,REF_CELL *ref_cell_ptr)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell;
  REF_STATUS RVar1;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell;
  REF_INT qua_nodes [27];
  REF_CELL qua;
  REF_CELL tri;
  REF_NODE ref_node;
  REF_CELL *ref_cell_ptr_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_grid_local._4_4_ = ref_cell_deep_copy(ref_cell_ptr,ref_grid->cell[3]);
  if (ref_grid_local._4_4_ == 0) {
    ref_cell = *ref_cell_ptr;
    unique0x00012000 = ref_grid->cell[6];
    for (ref_private_macro_code_rss_1 = 0;
        ref_private_macro_code_rss_1 < stack0xffffffffffffffc8->max;
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
      RVar1 = ref_cell_nodes(stack0xffffffffffffffc8,ref_private_macro_code_rss_1,
                             &ref_private_macro_code_rss);
      if ((RVar1 == 0) &&
         (uVar2 = ref_shard_add_qua_as_tri(ref_node_00,ref_cell,&ref_private_macro_code_rss),
         uVar2 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x45d,"ref_shard_extract_tri",(ulong)uVar2,"add tri");
        return uVar2;
      }
    }
    ref_grid_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x458,
           "ref_shard_extract_tri",(ulong)ref_grid_local._4_4_,"deep tri copy");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_shard_extract_tri(REF_GRID ref_grid,
                                         REF_CELL *ref_cell_ptr) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tri, qua;
  REF_INT qua_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  RSS(ref_cell_deep_copy(ref_cell_ptr, ref_grid_tri(ref_grid)),
      "deep tri copy");
  tri = *ref_cell_ptr;
  qua = ref_grid_qua(ref_grid);

  each_ref_cell_valid_cell_with_nodes(qua, cell, qua_nodes) {
    RSS(ref_shard_add_qua_as_tri(ref_node, tri, qua_nodes), "add tri");
  }

  return REF_SUCCESS;
}